

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::(anonymous_namespace)::pquote_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Path *p)

{
  long lVar1;
  long *plVar2;
  string *extraout_RAX;
  string *psVar3;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  Path::full_path_name_abi_cxx11_(&local_50,(Path *)this);
  local_b0 = local_a0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"<","");
  local_90[0] = local_80;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_90,">","");
  local_70[0] = local_60;
  ::std::__cxx11::string::_M_construct<char*>((string *)local_70,local_b0,local_a8 + (long)local_b0)
  ;
  ::std::__cxx11::string::_M_append((char *)local_70,(ulong)local_50._M_dataplus._M_p);
  plVar2 = (long *)::std::__cxx11::string::_M_append((char *)local_70,(ulong)local_90[0]);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  psVar3 = (string *)&local_50.field_2;
  if ((string *)local_50._M_dataplus._M_p != psVar3) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    psVar3 = extraout_RAX;
  }
  return psVar3;
}

Assistant:

std::string pquote(const Path &p) {
  return wquote(p.full_path_name(), "<", ">");
}